

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::DiscMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  undefined4 uVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float fVar27;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar37 [32];
  float fVar44;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  float fVar54;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar55 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  RayQueryContext *local_2b8;
  RTCFilterFunctionNArguments local_2b0;
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar70 [64];
  
  pSVar5 = context->scene;
  pGVar6 = (pSVar5->geometries).items[Disc->sharedGeomID].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar20._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[4] * _Var8);
  auVar20._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar23._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[5] * _Var8);
  auVar23._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar25._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[6] * _Var8);
  auVar25._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar28._16_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[7] * _Var8);
  auVar28._0_16_ = *(undefined1 (*) [16])(lVar7 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar21 = vunpcklps_avx(auVar20,auVar25);
  auVar12 = vunpckhps_avx(auVar20,auVar25);
  auVar13 = vunpcklps_avx(auVar23,auVar28);
  auVar28 = vunpckhps_avx(auVar23,auVar28);
  auVar20 = vunpcklps_avx(auVar21,auVar13);
  auVar13 = vunpckhps_avx(auVar21,auVar13);
  auVar25 = vunpcklps_avx(auVar12,auVar28);
  local_250 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_260 = local_250;
  uVar18 = *(undefined4 *)(ray + k * 4);
  auVar21._4_4_ = uVar18;
  auVar21._0_4_ = uVar18;
  auVar21._8_4_ = uVar18;
  auVar21._12_4_ = uVar18;
  auVar21._16_4_ = uVar18;
  auVar21._20_4_ = uVar18;
  auVar21._24_4_ = uVar18;
  auVar21._28_4_ = uVar18;
  auVar20 = vsubps_avx(auVar20,auVar21);
  uVar18 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar45._4_4_ = uVar18;
  auVar45._0_4_ = uVar18;
  auVar45._8_4_ = uVar18;
  auVar45._12_4_ = uVar18;
  auVar45._16_4_ = uVar18;
  auVar45._20_4_ = uVar18;
  auVar45._24_4_ = uVar18;
  auVar45._28_4_ = uVar18;
  uVar18 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar62._4_4_ = uVar18;
  auVar62._0_4_ = uVar18;
  auVar62._8_4_ = uVar18;
  auVar62._12_4_ = uVar18;
  auVar62._16_4_ = uVar18;
  auVar62._20_4_ = uVar18;
  auVar62._24_4_ = uVar18;
  auVar62._28_4_ = uVar18;
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar65 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar65 = vshufps_avx(auVar65,auVar65,0);
  auVar66._16_16_ = auVar65;
  auVar66._0_16_ = auVar65;
  auVar21 = vrcpps_avx(auVar66);
  auVar23 = vsubps_avx(auVar13,auVar45);
  auVar25 = vsubps_avx(auVar25,auVar62);
  auVar37._8_4_ = 0x3f800000;
  auVar37._0_8_ = 0x3f8000003f800000;
  auVar37._12_4_ = 0x3f800000;
  auVar37._16_4_ = 0x3f800000;
  auVar37._20_4_ = 0x3f800000;
  auVar37._24_4_ = 0x3f800000;
  auVar37._28_4_ = 0x3f800000;
  fVar36 = auVar21._0_4_;
  fVar38 = auVar21._4_4_;
  auVar13._4_4_ = fVar38 * auVar65._4_4_;
  auVar13._0_4_ = fVar36 * auVar65._0_4_;
  fVar39 = auVar21._8_4_;
  auVar13._8_4_ = fVar39 * auVar65._8_4_;
  fVar40 = auVar21._12_4_;
  auVar13._12_4_ = fVar40 * auVar65._12_4_;
  fVar41 = auVar21._16_4_;
  auVar13._16_4_ = fVar41 * auVar65._0_4_;
  fVar42 = auVar21._20_4_;
  auVar13._20_4_ = fVar42 * auVar65._4_4_;
  fVar43 = auVar21._24_4_;
  auVar13._24_4_ = fVar43 * auVar65._8_4_;
  auVar13._28_4_ = uVar18;
  auVar13 = vsubps_avx(auVar37,auVar13);
  fVar54 = auVar25._0_4_;
  fVar56 = auVar25._4_4_;
  fVar57 = auVar25._8_4_;
  fVar58 = auVar25._12_4_;
  fVar59 = auVar25._16_4_;
  fVar60 = auVar25._20_4_;
  fVar61 = auVar25._24_4_;
  fVar44 = auVar23._0_4_;
  fVar48 = auVar23._4_4_;
  fVar49 = auVar23._8_4_;
  fVar50 = auVar23._12_4_;
  fVar51 = auVar23._16_4_;
  fVar52 = auVar23._20_4_;
  fVar53 = auVar23._24_4_;
  fVar27 = auVar20._0_4_;
  fVar30 = auVar20._4_4_;
  fVar31 = auVar20._8_4_;
  fVar32 = auVar20._12_4_;
  fVar33 = auVar20._16_4_;
  fVar34 = auVar20._20_4_;
  fVar35 = auVar20._24_4_;
  fVar36 = (fVar27 * fVar1 + fVar44 * fVar2 + fVar54 * fVar3) * (fVar36 + fVar36 * auVar13._0_4_);
  fVar38 = (fVar30 * fVar1 + fVar48 * fVar2 + fVar56 * fVar3) * (fVar38 + fVar38 * auVar13._4_4_);
  local_200._4_4_ = fVar38;
  local_200._0_4_ = fVar36;
  fVar39 = (fVar31 * fVar1 + fVar49 * fVar2 + fVar57 * fVar3) * (fVar39 + fVar39 * auVar13._8_4_);
  local_200._8_4_ = fVar39;
  fVar40 = (fVar32 * fVar1 + fVar50 * fVar2 + fVar58 * fVar3) * (fVar40 + fVar40 * auVar13._12_4_);
  local_200._12_4_ = fVar40;
  fVar41 = (fVar33 * fVar1 + fVar51 * fVar2 + fVar59 * fVar3) * (fVar41 + fVar41 * auVar13._16_4_);
  local_200._16_4_ = fVar41;
  fVar42 = (fVar34 * fVar1 + fVar52 * fVar2 + fVar60 * fVar3) * (fVar42 + fVar42 * auVar13._20_4_);
  local_200._20_4_ = fVar42;
  fVar43 = (fVar35 * fVar1 + fVar53 * fVar2 + fVar61 * fVar3) * (fVar43 + fVar43 * auVar13._24_4_);
  local_200._24_4_ = fVar43;
  local_200._28_4_ = auVar21._28_4_ + auVar13._28_4_;
  uVar18 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar63._4_4_ = uVar18;
  auVar63._0_4_ = uVar18;
  auVar63._8_4_ = uVar18;
  auVar63._12_4_ = uVar18;
  auVar63._16_4_ = uVar18;
  auVar63._20_4_ = uVar18;
  auVar63._24_4_ = uVar18;
  auVar63._28_4_ = uVar18;
  auVar21 = vcmpps_avx(auVar63,local_200,2);
  uVar18 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar69._4_4_ = uVar18;
  auVar69._0_4_ = uVar18;
  auVar69._8_4_ = uVar18;
  auVar69._12_4_ = uVar18;
  auVar69._16_4_ = uVar18;
  auVar69._20_4_ = uVar18;
  auVar69._24_4_ = uVar18;
  auVar69._28_4_ = uVar18;
  auVar70 = ZEXT3264(auVar69);
  auVar13 = vcmpps_avx(local_200,auVar69,2);
  auVar21 = vandps_avx(auVar21,auVar13);
  auVar65 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar67._16_16_ = auVar65;
  auVar67._0_16_ = auVar65;
  auVar13 = vcvtdq2ps_avx(auVar67);
  auVar13 = vcmpps_avx(_DAT_01f7b060,auVar13,1);
  auVar37 = auVar13 & auVar21;
  if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar37 >> 0x7f,0) != '\0') ||
        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar37 >> 0xbf,0) != '\0') ||
      (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar37[0x1f] < '\0') {
    auVar21 = vandps_avx(auVar21,auVar13);
    auVar37 = vunpckhps_avx(auVar12,auVar28);
    auVar12._4_4_ = fVar1 * fVar38;
    auVar12._0_4_ = fVar1 * fVar36;
    auVar12._8_4_ = fVar1 * fVar39;
    auVar12._12_4_ = fVar1 * fVar40;
    auVar12._16_4_ = fVar1 * fVar41;
    auVar12._20_4_ = fVar1 * fVar42;
    auVar12._24_4_ = fVar1 * fVar43;
    auVar12._28_4_ = auVar28._28_4_;
    auVar14._4_4_ = fVar2 * fVar38;
    auVar14._0_4_ = fVar2 * fVar36;
    auVar14._8_4_ = fVar2 * fVar39;
    auVar14._12_4_ = fVar2 * fVar40;
    auVar14._16_4_ = fVar2 * fVar41;
    auVar14._20_4_ = fVar2 * fVar42;
    auVar14._24_4_ = fVar2 * fVar43;
    auVar14._28_4_ = auVar13._28_4_;
    auVar16._4_4_ = fVar3 * fVar38;
    auVar16._0_4_ = fVar3 * fVar36;
    auVar16._8_4_ = fVar3 * fVar39;
    auVar16._12_4_ = fVar3 * fVar40;
    auVar16._16_4_ = fVar3 * fVar41;
    auVar16._20_4_ = fVar3 * fVar42;
    auVar16._24_4_ = fVar3 * fVar43;
    auVar16._28_4_ = DAT_01f7b060._28_4_;
    auVar13 = vsubps_avx(auVar20,auVar12);
    auVar12 = vsubps_avx(auVar23,auVar14);
    auVar28 = vsubps_avx(auVar25,auVar16);
    auVar68._0_4_ =
         auVar12._0_4_ * auVar12._0_4_ + auVar28._0_4_ * auVar28._0_4_ +
         auVar13._0_4_ * auVar13._0_4_;
    auVar68._4_4_ =
         auVar12._4_4_ * auVar12._4_4_ + auVar28._4_4_ * auVar28._4_4_ +
         auVar13._4_4_ * auVar13._4_4_;
    auVar68._8_4_ =
         auVar12._8_4_ * auVar12._8_4_ + auVar28._8_4_ * auVar28._8_4_ +
         auVar13._8_4_ * auVar13._8_4_;
    auVar68._12_4_ =
         auVar12._12_4_ * auVar12._12_4_ + auVar28._12_4_ * auVar28._12_4_ +
         auVar13._12_4_ * auVar13._12_4_;
    auVar68._16_4_ =
         auVar12._16_4_ * auVar12._16_4_ + auVar28._16_4_ * auVar28._16_4_ +
         auVar13._16_4_ * auVar13._16_4_;
    auVar68._20_4_ =
         auVar12._20_4_ * auVar12._20_4_ + auVar28._20_4_ * auVar28._20_4_ +
         auVar13._20_4_ * auVar13._20_4_;
    auVar68._24_4_ =
         auVar12._24_4_ * auVar12._24_4_ + auVar28._24_4_ * auVar28._24_4_ +
         auVar13._24_4_ * auVar13._24_4_;
    auVar68._28_4_ = auVar12._28_4_ + auVar28._28_4_ + auVar13._28_4_;
    auVar15._4_4_ = auVar37._4_4_ * auVar37._4_4_;
    auVar15._0_4_ = auVar37._0_4_ * auVar37._0_4_;
    auVar15._8_4_ = auVar37._8_4_ * auVar37._8_4_;
    auVar15._12_4_ = auVar37._12_4_ * auVar37._12_4_;
    auVar15._16_4_ = auVar37._16_4_ * auVar37._16_4_;
    auVar15._20_4_ = auVar37._20_4_ * auVar37._20_4_;
    auVar15._24_4_ = auVar37._24_4_ * auVar37._24_4_;
    auVar15._28_4_ = auVar13._28_4_;
    auVar13 = vcmpps_avx(auVar68,auVar15,2);
    auVar12 = auVar21 & auVar13;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar21 = vandps_avx(auVar21,auVar13);
      auVar46._0_4_ = fVar54 * fVar54 + fVar44 * fVar44;
      auVar46._4_4_ = fVar56 * fVar56 + fVar48 * fVar48;
      auVar46._8_4_ = fVar57 * fVar57 + fVar49 * fVar49;
      auVar46._12_4_ = fVar58 * fVar58 + fVar50 * fVar50;
      auVar46._16_4_ = fVar59 * fVar59 + fVar51 * fVar51;
      auVar46._20_4_ = fVar60 * fVar60 + fVar52 * fVar52;
      auVar46._24_4_ = fVar61 * fVar61 + fVar53 * fVar53;
      auVar46._28_4_ = auVar25._28_4_ + auVar23._28_4_;
      auVar29._0_4_ = fVar27 * fVar27 + auVar46._0_4_;
      auVar29._4_4_ = fVar30 * fVar30 + auVar46._4_4_;
      auVar29._8_4_ = fVar31 * fVar31 + auVar46._8_4_;
      auVar29._12_4_ = fVar32 * fVar32 + auVar46._12_4_;
      auVar29._16_4_ = fVar33 * fVar33 + auVar46._16_4_;
      auVar29._20_4_ = fVar34 * fVar34 + auVar46._20_4_;
      auVar29._24_4_ = fVar35 * fVar35 + auVar46._24_4_;
      auVar29._28_4_ = auVar20._28_4_ + auVar46._28_4_;
      auVar13 = vcmpps_avx(auVar29,auVar15,6);
      auVar20 = auVar21 & auVar13;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar21 = vandps_avx(auVar13,auVar21);
        local_1e0._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
        local_1e0._8_4_ = -fVar1;
        local_1e0._12_4_ = -fVar1;
        local_1e0._16_4_ = -fVar1;
        local_1e0._20_4_ = -fVar1;
        local_1e0._24_4_ = -fVar1;
        local_1e0._28_4_ = -fVar1;
        local_1a0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_1a0._8_4_ = -fVar3;
        local_1a0._12_4_ = -fVar3;
        local_1a0._16_4_ = -fVar3;
        local_1a0._20_4_ = -fVar3;
        local_1a0._24_4_ = -fVar3;
        local_1a0._28_4_ = -fVar3;
        local_220 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_240 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_1c0[0] = -fVar2;
        local_1c0[1] = -fVar2;
        local_1c0[2] = -fVar2;
        local_1c0[3] = -fVar2;
        fStack_1b0 = -fVar2;
        fStack_1ac = -fVar2;
        fStack_1a8 = -fVar2;
        fStack_1a4 = -fVar2;
        uVar18 = vmovmskps_avx(auVar21);
        uVar19 = CONCAT44((int)((ulong)ray >> 0x20),uVar18);
        uVar17 = 1 << ((byte)k & 0x1f);
        auVar21 = vcmpps_avx(auVar46,auVar46,0xf);
        auVar47 = ZEXT3264(auVar21);
        auVar55 = ZEXT464(0) << 0x20;
        auVar64 = ZEXT3264(CONCAT428(0xff800000,
                                     CONCAT424(0xff800000,
                                               CONCAT420(0xff800000,
                                                         CONCAT416(0xff800000,
                                                                   CONCAT412(0xff800000,
                                                                             CONCAT48(0xff800000,
                                                                                                                                                                            
                                                  0xff800000ff800000)))))));
        do {
          local_2b0.hit = local_180;
          local_2b0.valid = (int *)local_2e0;
          uVar10 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar4 = *(uint *)(local_260 + uVar10 * 4);
          pGVar6 = (pSVar5->geometries).items[uVar4].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            local_120 = *(undefined4 *)(local_240 + uVar10 * 4);
            local_100 = *(undefined4 *)(local_220 + uVar10 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar10 * 4);
            local_2b0.context = context->user;
            local_e0 = (Disc->primIDs).field_0.i[uVar10];
            fVar1 = local_1c0[uVar10 - 8];
            fVar2 = local_1c0[uVar10];
            local_160._4_4_ = fVar2;
            local_160._0_4_ = fVar2;
            local_160._8_4_ = fVar2;
            local_160._12_4_ = fVar2;
            local_160._16_4_ = fVar2;
            local_160._20_4_ = fVar2;
            local_160._24_4_ = fVar2;
            local_160._28_4_ = fVar2;
            local_b0 = vpshufd_avx(ZEXT416(uVar4),0);
            uVar18 = *(undefined4 *)(local_1a0 + uVar10 * 4);
            local_140._4_4_ = uVar18;
            local_140._0_4_ = uVar18;
            local_140._8_4_ = uVar18;
            local_140._12_4_ = uVar18;
            local_140._16_4_ = uVar18;
            local_140._20_4_ = uVar18;
            local_140._24_4_ = uVar18;
            local_140._28_4_ = uVar18;
            local_180[0] = (RTCHitN)SUB41(fVar1,0);
            local_180[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[4] = (RTCHitN)SUB41(fVar1,0);
            local_180[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[8] = (RTCHitN)SUB41(fVar1,0);
            local_180[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0xc] = (RTCHitN)SUB41(fVar1,0);
            local_180[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x10] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x11] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x14] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x15] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x18] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x19] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            local_180[0x1c] = (RTCHitN)SUB41(fVar1,0);
            local_180[0x1d] = (RTCHitN)(char)((uint)fVar1 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = local_b0;
            uStack_9c = (local_2b0.context)->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = (local_2b0.context)->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            local_2e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar17 & 0xf) << 4));
            local_2d0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar17 >> 4) * 0x10);
            local_2b0.geometryUserPtr = pGVar6->userPtr;
            local_2b0.N = 8;
            local_2b0.ray = (RTCRayN *)ray;
            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              local_280 = auVar70._0_32_;
              auVar21 = ZEXT1632(auVar47._0_16_);
              local_2b8 = context;
              (*pGVar6->occlusionFilterN)(&local_2b0);
              auVar64 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar21 = vcmpps_avx(auVar21,auVar21,0xf);
              auVar47 = ZEXT3264(auVar21);
              auVar70 = ZEXT3264(local_280);
              context = local_2b8;
            }
            auVar65 = vpcmpeqd_avx(auVar55._0_16_,local_2e0);
            auVar11 = vpcmpeqd_avx(auVar55._0_16_,local_2d0);
            auVar26._16_16_ = auVar11;
            auVar26._0_16_ = auVar65;
            auVar21 = auVar47._0_32_ & ~auVar26;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0x7f,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0xbf,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar21[0x1f]) {
              auVar22._0_4_ = auVar65._0_4_ ^ auVar47._0_4_;
              auVar22._4_4_ = auVar65._4_4_ ^ auVar47._4_4_;
              auVar22._8_4_ = auVar65._8_4_ ^ auVar47._8_4_;
              auVar22._12_4_ = auVar65._12_4_ ^ auVar47._12_4_;
              auVar22._16_4_ = auVar11._0_4_ ^ auVar47._16_4_;
              auVar22._20_4_ = auVar11._4_4_ ^ auVar47._20_4_;
              auVar22._24_4_ = auVar11._8_4_ ^ auVar47._24_4_;
              auVar22._28_4_ = auVar11._12_4_ ^ auVar47._28_4_;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                local_280 = auVar70._0_32_;
                auVar21 = ZEXT1632(auVar47._0_16_);
                (*p_Var9)(&local_2b0);
                auVar64 = ZEXT3264(CONCAT428(0xff800000,
                                             CONCAT424(0xff800000,
                                                       CONCAT420(0xff800000,
                                                                 CONCAT416(0xff800000,
                                                                           CONCAT412(0xff800000,
                                                                                     CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
                auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar21 = vcmpps_avx(auVar21,auVar21,0xf);
                auVar47 = ZEXT3264(auVar21);
                auVar70 = ZEXT3264(local_280);
              }
              auVar65 = vpcmpeqd_avx(auVar55._0_16_,local_2e0);
              auVar11 = vpcmpeqd_avx(auVar55._0_16_,local_2d0);
              auVar24._16_16_ = auVar11;
              auVar24._0_16_ = auVar65;
              auVar22._0_4_ = auVar65._0_4_ ^ auVar47._0_4_;
              auVar22._4_4_ = auVar65._4_4_ ^ auVar47._4_4_;
              auVar22._8_4_ = auVar65._8_4_ ^ auVar47._8_4_;
              auVar22._12_4_ = auVar65._12_4_ ^ auVar47._12_4_;
              auVar22._16_4_ = auVar11._0_4_ ^ auVar47._16_4_;
              auVar22._20_4_ = auVar11._4_4_ ^ auVar47._20_4_;
              auVar22._24_4_ = auVar11._8_4_ ^ auVar47._24_4_;
              auVar22._28_4_ = auVar11._12_4_ ^ auVar47._28_4_;
              auVar21 = vblendvps_avx(auVar64._0_32_,*(undefined1 (*) [32])(local_2b0.ray + 0x100),
                                      auVar24);
              *(undefined1 (*) [32])(local_2b0.ray + 0x100) = auVar21;
            }
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0x7f,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0xbf,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar22[0x1f] < '\0') {
              return true;
            }
            *(int *)(ray + k * 4 + 0x100) = auVar70._0_4_;
          }
          uVar19 = uVar19 ^ 1L << (uVar10 & 0x3f);
        } while (uVar19 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }